

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxInIndex
          (ConfidentialTransaction *this,Txid *txid,uint32_t vout)

{
  pointer pCVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *this_00;
  long lVar4;
  ulong uVar5;
  allocator local_5d;
  uint local_5c;
  undefined1 local_58 [32];
  size_t is_coinbase;
  
  is_coinbase = 0;
  wally_tx_is_coinbase((this->super_AbstractTransaction).wally_tx_pointer_,&is_coinbase);
  local_5c = vout & 0x3fffffff;
  if (is_coinbase != 0) {
    local_5c = vout;
  }
  lVar4 = 0;
  uVar5 = 0;
  do {
    pCVar1 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->vin_).
                       super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x160) <= uVar5)
    {
      local_58._0_8_ = "cfdcore_elements_transaction.cpp";
      local_58._8_4_ = 0x5b9;
      local_58._16_8_ = "GetTxInIndex";
      logger::warn<>((CfdSourceLocation *)local_58,"Txid is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_58,"Txid is not found.",&local_5d);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    AbstractTxIn::GetTxid
              ((Txid *)local_58,
               (AbstractTxIn *)((long)&(pCVar1->super_AbstractTxIn)._vptr_AbstractTxIn + lVar4));
    bVar2 = Txid::Equals((Txid *)local_58,txid);
    if (bVar2) {
      uVar3 = AbstractTxIn::GetVout
                        ((AbstractTxIn *)
                         ((long)&(((this->vin_).
                                   super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn).
                                 _vptr_AbstractTxIn + lVar4));
      Txid::~Txid((Txid *)local_58);
      if (uVar3 == local_5c) {
        return (uint32_t)uVar5;
      }
    }
    else {
      Txid::~Txid((Txid *)local_58);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x160;
  } while( true );
}

Assistant:

uint32_t ConfidentialTransaction::GetTxInIndex(
    const Txid &txid, uint32_t vout) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);

  uint32_t index = (is_coinbase == 0) ? vout & kTxInVoutMask : vout;
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == index) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}